

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O3

void __thiscall duckdb::PerfectAggregateHashTable::Destroy(PerfectAggregateHashTable *this)

{
  shared_ptr<duckdb::TupleDataLayout,_true> *this_00;
  pointer pAVar1;
  data_ptr_t pdVar2;
  byte bVar3;
  byte bVar4;
  TupleDataLayout *pTVar5;
  type pTVar6;
  ulong uVar7;
  AggregateObject *aggr;
  pointer pAVar8;
  idx_t count;
  ulong uVar9;
  data_ptr_t pdVar10;
  bool bVar11;
  undefined1 local_48 [8];
  _Head_base<0UL,_duckdb::Vector_*,_false> local_40;
  Vector *local_38;
  
  this_00 = &(this->super_BaseAggregateHashTable).layout_ptr;
  pTVar5 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->(this_00);
  pAVar8 = (pTVar5->aggregates).
           super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
           super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (pTVar5->aggregates).
           super_vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
           super__Vector_base<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pAVar8 != pAVar1) {
    bVar4 = 0;
    do {
      bVar3 = bVar4;
      bVar11 = (pAVar8->function).destructor != (aggregate_destructor_t)0x0;
      pAVar8 = pAVar8 + 1;
      bVar4 = bVar3 | bVar11;
    } while (pAVar8 != pAVar1);
    if ((bool)(bVar3 | bVar11)) {
      local_38 = &this->addresses;
      pdVar2 = (this->addresses).data;
      local_48 = (undefined1  [8])
                 unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                 ::operator*(&this->aggregate_allocator);
      local_40._M_head_impl = (Vector *)0x0;
      uVar7 = this->total_groups;
      if (uVar7 == 0) {
        count = 0;
      }
      else {
        pdVar10 = this->data;
        uVar9 = 0;
        count = 0;
        do {
          *(data_ptr_t *)(pdVar2 + count * 8) = pdVar10;
          count = count + 1;
          if (count == 0x800) {
            pTVar6 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
            RowOperations::DestroyStates((RowOperationsState *)local_48,pTVar6,local_38,0x800);
            uVar7 = this->total_groups;
            count = 0;
          }
          pdVar10 = pdVar10 + this->tuple_size;
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar7);
      }
      pTVar6 = shared_ptr<duckdb::TupleDataLayout,_true>::operator*(this_00);
      RowOperations::DestroyStates((RowOperationsState *)local_48,pTVar6,local_38,count);
      if ((_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
          local_40._M_head_impl != (Vector *)0x0) {
        ::std::default_delete<duckdb::Vector>::operator()
                  ((default_delete<duckdb::Vector> *)&local_40,local_40._M_head_impl);
      }
    }
  }
  return;
}

Assistant:

void PerfectAggregateHashTable::Destroy() {
	// check if there is any destructor to call
	bool has_destructor = false;
	for (auto &aggr : layout_ptr->GetAggregates()) {
		if (aggr.function.destructor) {
			has_destructor = true;
		}
	}
	if (!has_destructor) {
		return;
	}
	// there are aggregates with destructors: loop over the hash table
	// and call the destructor method for each of the aggregates
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	idx_t count = 0;

	// iterate over all initialised slots of the hash table
	RowOperationsState row_state(*aggregate_allocator);
	data_ptr_t payload_ptr = data;
	for (idx_t i = 0; i < total_groups; i++) {
		data_pointers[count++] = payload_ptr;
		if (count == STANDARD_VECTOR_SIZE) {
			RowOperations::DestroyStates(row_state, *layout_ptr, addresses, count);
			count = 0;
		}
		payload_ptr += tuple_size;
	}
	RowOperations::DestroyStates(row_state, *layout_ptr, addresses, count);
}